

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

ggml_tensor * ggml_diag_mask_inf(ggml_context *ctx,ggml_tensor *a,int n_past)

{
  int *piVar1;
  ggml_tensor *pgVar2;
  ggml_tensor *pgVar3;
  ggml_tensor *extraout_RAX;
  ggml_tensor *in_RCX;
  int extraout_EDX;
  ggml_tensor *extraout_RDX;
  ggml_tensor *extraout_RDX_00;
  ggml_tensor *extraout_RDX_01;
  ggml_tensor *extraout_RDX_02;
  ggml_tensor *unaff_RBX;
  ggml_tensor *in_R8;
  ggml_tensor *in_R9;
  ggml_tensor *unaff_R14;
  int iStack_b8;
  int iStack_b4;
  undefined8 uStack_b0;
  ggml_tensor *pgStack_a0;
  ggml_tensor *pgStack_98;
  ggml_type gStack_90;
  int iStack_8c;
  undefined8 uStack_88;
  ggml_tensor *pgStack_78;
  int iStack_64;
  
  if (a->grad == (ggml_tensor *)0x0) {
    pgVar2 = ggml_new_tensor_impl(ctx,a->type,a->n_dims,a->ne,a->data);
    pgVar3 = ggml_new_i32(ctx,n_past);
    pgVar2->op = GGML_OP_DIAG_MASK_INF;
    pgVar2->grad = (ggml_tensor *)0x0;
    pgVar2->src0 = a;
    pgVar2->src1 = pgVar3;
    return pgVar2;
  }
  ggml_diag_mask_inf_cold_1();
  if (a->grad == (ggml_tensor *)0x0) {
    pgVar2 = ggml_new_tensor_impl(ctx,a->type,a->n_dims,a->ne,a->data);
    pgVar2->op = GGML_OP_SOFT_MAX;
    pgVar2->grad = (ggml_tensor *)0x0;
    pgVar2->src0 = a;
    pgVar2->src1 = (ggml_tensor *)0x0;
    return pgVar2;
  }
  ggml_soft_max_cold_1();
  if (extraout_EDX < 0) {
    ggml_rope_cold_1();
  }
  else {
    unaff_RBX = a;
    if (a->grad == (ggml_tensor *)0x0) {
      pgVar2 = ggml_new_tensor_impl(ctx,a->type,a->n_dims,a->ne,a->data);
      pgVar3 = ggml_new_tensor_impl(ctx,GGML_TYPE_I32,1,&iStack_64,(void *)0x0);
      piVar1 = (int *)pgVar3->data;
      *piVar1 = extraout_EDX;
      piVar1[1] = (int)in_RCX;
      piVar1[2] = (int)in_R8;
      pgVar2->op = GGML_OP_ROPE;
      pgVar2->grad = (ggml_tensor *)0x0;
      pgVar2->src0 = a;
      pgVar2->src1 = pgVar3;
      return pgVar2;
    }
  }
  ggml_rope_cold_2();
  pgVar2 = unaff_RBX;
  pgStack_78 = unaff_RBX;
  if ((extraout_RDX->ne[2] == 1) && (pgVar2 = extraout_RDX, extraout_RDX->ne[3] == 1)) {
    unaff_R14 = a;
    if (a->ne[1] != extraout_RDX->ne[1]) goto LAB_00121179;
    if (a->ne[3] == 1) {
      if ((a->grad == (ggml_tensor *)0x0) && (extraout_RDX->grad == (ggml_tensor *)0x0)) {
        gStack_90 = extraout_RDX->ne[0];
        iStack_8c = a->ne[2];
        uStack_88 = 0x100000001;
        pgStack_98 = (ggml_tensor *)0x121150;
        pgVar2 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,2,(int *)&gStack_90,(void *)0x0);
        pgVar2->op = GGML_OP_CONV_1D_1S;
        pgVar2->grad = (ggml_tensor *)0x0;
        pgVar2->src0 = a;
        pgVar2->src1 = extraout_RDX;
        return pgVar2;
      }
      goto LAB_00121174;
    }
  }
  else {
    pgStack_98 = (ggml_tensor *)0x121174;
    ggml_conv_1d_1s_cold_1();
LAB_00121174:
    pgStack_98 = (ggml_tensor *)0x121179;
    ggml_conv_1d_1s_cold_4();
LAB_00121179:
    pgStack_98 = (ggml_tensor *)0x12117e;
    ggml_conv_1d_1s_cold_2();
  }
  pgStack_98 = (ggml_tensor *)ggml_conv_1d_2s;
  ggml_conv_1d_1s_cold_3();
  pgStack_a0 = pgVar2;
  pgStack_98 = unaff_R14;
  if ((extraout_RDX_00->ne[2] == 1) && (extraout_RDX_00->ne[3] == 1)) {
    if (a->ne[1] == extraout_RDX_00->ne[1]) {
      if (a->ne[3] != 1) goto LAB_00121223;
      if ((a->grad == (ggml_tensor *)0x0) && (extraout_RDX_00->grad == (ggml_tensor *)0x0)) {
        iStack_b8 = extraout_RDX_00->ne[0] / 2;
        iStack_b4 = a->ne[2];
        uStack_b0 = 0x100000001;
        pgVar2 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,2,&iStack_b8,(void *)0x0);
        pgVar2->op = GGML_OP_CONV_1D_2S;
        pgVar2->grad = (ggml_tensor *)0x0;
        pgVar2->src0 = a;
        pgVar2->src1 = extraout_RDX_00;
        return pgVar2;
      }
      goto LAB_00121219;
    }
  }
  else {
    ggml_conv_1d_2s_cold_1();
LAB_00121219:
    ggml_conv_1d_2s_cold_4();
  }
  ggml_conv_1d_2s_cold_2();
LAB_00121223:
  ggml_conv_1d_2s_cold_3();
  if (((extraout_RDX_01->ne[0] == a->ne[0]) && (extraout_RDX_01->ne[2] == a->ne[2])) &&
     (extraout_RDX_01->ne[3] == a->ne[3])) {
    if (((a->grad == (ggml_tensor *)0x0) && (extraout_RDX_01->grad == (ggml_tensor *)0x0)) &&
       (in_RCX->grad == (ggml_tensor *)0x0)) {
      pgVar2 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,4,a->ne,(void *)0x0);
      pgVar2->op = GGML_OP_FLASH_ATTN;
      pgVar2->grad = (ggml_tensor *)0x0;
      pgVar2->src0 = a;
      pgVar2->src1 = extraout_RDX_01;
      pgVar2->opt[0] = in_RCX;
      pgVar3 = ggml_new_i32(ctx,(uint)in_R8 & 0xff);
      pgVar2->opt[1] = pgVar3;
      return pgVar2;
    }
  }
  else {
    ggml_flash_attn_cold_1();
  }
  ggml_flash_attn_cold_2();
  if (((extraout_RDX_02->ne[0] == a->ne[0]) && (extraout_RDX_02->ne[2] == a->ne[2])) &&
     (extraout_RDX_02->ne[3] == a->ne[3])) {
    if ((((a->grad == (ggml_tensor *)0x0) && (extraout_RDX_02->grad == (ggml_tensor *)0x0)) &&
        (in_RCX->grad == (ggml_tensor *)0x0)) &&
       ((in_R8->grad == (ggml_tensor *)0x0 && (in_R9->grad == (ggml_tensor *)0x0)))) {
      pgVar2 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,4,a->ne,(void *)0x0);
      pgVar2->op = GGML_OP_FLASH_FF;
      pgVar2->grad = (ggml_tensor *)0x0;
      pgVar2->src0 = a;
      pgVar2->src1 = extraout_RDX_02;
      pgVar2->opt[0] = in_RCX;
      pgVar2->opt[1] = in_R8;
      pgVar2->opt[2] = in_R9;
      return pgVar2;
    }
    ggml_flash_ff_cold_2();
  }
  ggml_flash_ff_cold_1();
  a->is_param = true;
  if (a->grad == (ggml_tensor *)0x0) {
    pgVar2 = ggml_new_tensor_impl(ctx,a->type,a->n_dims,a->ne,(void *)0x0);
    a->grad = pgVar2;
    return pgVar2;
  }
  ggml_set_param_cold_1();
  ggml_build_forward_impl((ggml_cgraph *)ctx,a,true);
  return extraout_RAX;
}

Assistant:

struct ggml_tensor * ggml_diag_mask_inf(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   n_past) {
    bool is_node = false;

    if (a->grad) {
        GGML_ASSERT(false); // TODO: implement backward
        is_node = true;
    }

    // TODO: when implement backward, fix this:
    //struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);
    struct ggml_tensor * result = ggml_view_tensor(ctx, a);
    struct ggml_tensor * b = ggml_new_i32(ctx, n_past);

    result->op   = GGML_OP_DIAG_MASK_INF;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = b;

    return result;
}